

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_context_destroy(secp256k1_context *ctx)

{
  int iVar1;
  void *in_RDI;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  bool bVar2;
  
  bVar2 = true;
  if (in_RDI != (void *)0x0) {
    iVar1 = secp256k1_context_is_proper((secp256k1_context *)0x1019e1);
    bVar2 = iVar1 != 0;
  }
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    if (in_RDI != (void *)0x0) {
      secp256k1_context_preallocated_destroy
                ((secp256k1_context *)CONCAT17(bVar2,in_stack_fffffffffffffff0));
      free(in_RDI);
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT17(bVar2,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void secp256k1_context_destroy(secp256k1_context* ctx) {
    ARG_CHECK_VOID(ctx == NULL || secp256k1_context_is_proper(ctx));

    /* Defined as noop */
    if (ctx == NULL) {
        return;
    }

    secp256k1_context_preallocated_destroy(ctx);
    free(ctx);
}